

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O2

pair<double,_int> Min(vector<double,_std::allocator<double>_> *a)

{
  double dVar1;
  pointer pdVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  double dVar5;
  pair<double,_int> pVar6;
  
  pdVar2 = (a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  dVar5 = 100000000.0;
  uVar3 = 0;
  for (uVar4 = 0;
      (long)(a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
            ._M_finish - (long)pdVar2 >> 3 != uVar4; uVar4 = uVar4 + 1) {
    dVar1 = pdVar2[uVar4];
    if (dVar1 < dVar5) {
      uVar3 = uVar4 & 0xffffffff;
      dVar5 = dVar1;
    }
  }
  pVar6._8_8_ = uVar3;
  pVar6.first = dVar5;
  return pVar6;
}

Assistant:

pair<double, int> Min(const vector<double>& a) {
    double smallest = 1e+8;
    int smIdx = 0;
    for(int i=0; i<a.size(); i++){
        if(a[i] < smallest){
            smallest = a[i];
            smIdx = i;
        }
    }
    return pair<double, int>(smallest, smIdx);
}